

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_axis.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_axis::ArchiveIN(ChFunctionRotation_axis *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_48;
  shared_ptr<chrono::ChFunction> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_axis>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  local_48._value = &this->fangle;
  local_48._name = "fangle";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_48);
  local_30.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->axis;
  local_48._value = &local_30;
  local_48._name = "axis";
  local_48._flags = '\0';
  local_30.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b03258;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_48);
  return;
}

Assistant:

void ChFunctionRotation_axis::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_axis>();
	// deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(fangle);
	marchive >> CHNVP(axis);
}